

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_acid_breath(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  act("$n spits acid at $N.",ch,(void *)0x0,vo,1);
  act("$n spits a stream of corrosive acid at you.",ch,(void *)0x0,vo,2);
  act("You spit acid at $N.",ch,(void *)0x0,vo,3);
  iVar3 = ch->hit;
  iVar2 = dice(level,4);
  iVar2 = iVar2 + iVar3 / 9;
  if (ch->hit <= iVar2) {
    iVar2 = ch->hit;
  }
  bVar1 = saves_spell(level,(CHAR_DATA *)vo,7);
  if (bVar1) {
    iVar3 = iVar2 + 3;
    if (-1 < iVar2) {
      iVar3 = iVar2;
    }
    acid_effect(vo,level / 2,iVar3 >> 2,0);
    iVar2 = iVar2 / 2;
  }
  else {
    acid_effect(vo,level,iVar2,0);
  }
  damage_old(ch,(CHAR_DATA *)vo,iVar2,sn,7,true);
  return;
}

Assistant:

void spell_acid_breath(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	int dam, hp_dam, dice_dam, hpch;

	act("$n spits acid at $N.", ch, nullptr, victim, TO_NOTVICT);
	act("$n spits a stream of corrosive acid at you.", ch, nullptr, victim, TO_VICT);
	act("You spit acid at $N.", ch, nullptr, victim, TO_CHAR);

	hpch = ch->hit / 9;
	dice_dam = dice(level, 4);
	dam = hpch + dice_dam;

	if (dam > ch->hit)
		dam = ch->hit;

	hp_dam = 0;

	/*
	hpch = std::max(12,ch->hit);
	hp_dam = number_range(hpch/11 + 1, hpch/6);
	dice_dam = dice(level,16);

	dam = std::max(hp_dam + dice_dam/10,dice_dam + hp_dam/10);
	*/

	if (saves_spell(level, victim, DAM_ACID))
	{
		acid_effect(victim, level / 2, dam / 4, TARGET_CHAR);
		damage_old(ch, victim, dam / 2, sn, DAM_ACID, true);
	}
	else
	{
		acid_effect(victim, level, dam, TARGET_CHAR);
		damage_old(ch, victim, dam, sn, DAM_ACID, true);
	}
}